

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O2

void __thiscall PathTracerThread::SetPause(PathTracerThread *this,bool pause)

{
  __sighandler_t __handler;
  undefined3 in_register_00000031;
  int __sig;
  double dVar1;
  
  __sig = CONCAT31(in_register_00000031,pause);
  if ((bool)((this->m_pause)._M_base._M_i & 1U) != pause) {
    dVar1 = glfwGetTime();
    this->m_time = dVar1 - this->m_time;
    (this->m_pause)._M_base._M_i = pause;
    spdlog::debug<char[25]>((char (*) [25])"m_pause_semaphore signal");
    binary_semaphore::signal(&this->m_pause_semaphore,__sig,__handler);
    return;
  }
  return;
}

Assistant:

void PathTracerThread::SetPause(bool pause) {
	if (pause == m_pause)
		return;
	m_time = glfwGetTime() - m_time;
	m_pause.store(pause, std::memory_order_release);

	spdlog::debug("m_pause_semaphore signal");
	m_pause_semaphore.signal();
}